

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O1

string * __thiscall
verilogAST::Always::toString_abi_cxx11_(string *__return_storage_ptr__,Always *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer puVar3;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  pointer puVar7;
  pointer pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitivity_strs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  Always *local_90;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_c0 = __return_storage_ptr__;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = (this->sensitivity_list).
           super__Vector_base<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->sensitivity_list).
           super__Vector_base<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = this;
  if (pvVar8 != pvVar2) {
    do {
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>_&>
        ::_S_vtable._M_arr
        [(pvVar8->
         super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::PosEdge,_std::default_delete<verilogAST::PosEdge>_>,_std::unique_ptr<verilogAST::NegEdge,_std::default_delete<verilogAST::NegEdge>_>,_std::unique_ptr<verilogAST::Star,_std::default_delete<verilogAST::Star>_>_>
         ).
         super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
         .
         super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
         .
         super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
         .
         super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
         .
         super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::PosEdge>,_std::unique_ptr<verilogAST::NegEdge>,_std::unique_ptr<verilogAST::Star>_>
         ._M_index]._M_data)(&local_e0,(anon_class_1_0_00000001 *)local_88,pvVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 &local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != pvVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_b8);
  psVar4 = local_c0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,", ","");
  join(&local_e0,&local_48,&local_68);
  std::__cxx11::string::_M_append((char *)psVar4,(ulong)local_e0._M_dataplus._M_p);
  paVar1 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::__cxx11::string::append((char *)psVar4);
  puVar7 = (local_90->body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_90->body).
           super__Vector_base<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>,_std::allocator<std::unique_ptr<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    do {
      (*(code *)**(undefined8 **)
                  (puVar7->_M_t).
                  super___uniq_ptr_impl<verilogAST::BehavioralStatement,_std::default_delete<verilogAST::BehavioralStatement>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::BehavioralStatement_*,_std::default_delete<verilogAST::BehavioralStatement>_>
                  .super__Head_base<0UL,_verilogAST::BehavioralStatement_*,_false>._M_head_impl)
                (local_88);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_88);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_e0.field_2._M_allocated_capacity = *psVar6;
        local_e0.field_2._8_8_ = plVar5[3];
        local_e0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar6;
        local_e0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_e0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  psVar4 = local_c0;
  std::__cxx11::string::append((char *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return psVar4;
}

Assistant:

std::string Always::toString() {
  std::string always_str = "";
  always_str += "always @(";

  // emit sensitivity string
  std::vector<std::string> sensitivity_strs;
  for (auto &it : sensitivity_list) {
    sensitivity_strs.push_back(variant_to_string(it));
  }
  always_str += join(sensitivity_strs, ", ");
  always_str += ") begin\n";

  // emit body
  for (auto &statement : body) {
    always_str += statement->toString() + "\n";
  }

  always_str += "end\n";
  return always_str;
}